

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBucket.cpp
# Opt level: O3

void __thiscall
Memory::
SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::Verify(SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
         *this)

{
  RecyclerVerifyListConsistencyData *in_R8;
  anon_class_16_2_364abe19 fn;
  undefined1 local_30 [8];
  RecyclerVerifyListConsistencyData recyclerVerifyListConsistencyData;
  
  SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  ::Verify(&this->
            super_SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
          );
  recyclerVerifyListConsistencyData.mediumBlockVerifyListConsistencyData.expectFull = false;
  recyclerVerifyListConsistencyData.mediumBlockVerifyListConsistencyData.expectDispose = false;
  recyclerVerifyListConsistencyData.mediumBlockVerifyListConsistencyData.
  hasSetupVerifyListConsistencyData = false;
  recyclerVerifyListConsistencyData.mediumBlockVerifyListConsistencyData._3_5_ = 0;
  recyclerVerifyListConsistencyData.smallBlockVerifyListConsistencyData.nextAllocableBlockHead._0_2_
       = 0x100;
  recyclerVerifyListConsistencyData.smallBlockVerifyListConsistencyData.nextAllocableBlockHead._2_1_
       = 1;
  fn.recyclerVerifyListConsistencyData = in_R8;
  fn.this = (SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             *)local_30;
  HeapBlockList::
  ForEach<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::Verify()::_lambda(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            ((HeapBlockList *)this->pendingDisposeList,
             (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
             (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)this,fn);
  return;
}

Assistant:

void
SmallFinalizableHeapBucketBaseT<TBlockType>::Verify()
{
    BaseT::Verify();

#if DBG
    RecyclerVerifyListConsistencyData recyclerVerifyListConsistencyData;
    if (TBlockType::HeapBlockAttributes::IsSmallBlock)
    {
        recyclerVerifyListConsistencyData.SetupVerifyListConsistencyDataForSmallBlock(nullptr, false, true);
    }
    else if (TBlockType::HeapBlockAttributes::IsMediumBlock)
    {
        recyclerVerifyListConsistencyData.SetupVerifyListConsistencyDataForMediumBlock(nullptr, false, true);
    }
    else
    {
        Assert(false);
    }

    HeapBlockList::ForEach(this->pendingDisposeList, [this, &recyclerVerifyListConsistencyData](TBlockType * heapBlock)
    {
        DebugOnly(this->VerifyBlockConsistencyInList(heapBlock, recyclerVerifyListConsistencyData));
        heapBlock->Verify(true);
    });
#endif

}